

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooks.c
# Opt level: O1

int scandirat64(int dirfd,char *dirp,dirent64 ***namelist,_func_int_dirent64_ptr *filter,
               _func_int_dirent64_ptr_ptr_dirent64_ptr_ptr *compar)

{
  int iVar1;
  code *pcVar2;
  char *__ptr;
  
  pcVar2 = (code *)dlsym(0xffffffffffffffff,"scandirat64");
  __ptr = apprun_redirect_path_if_absolute(dirp);
  iVar1 = (*pcVar2)(dirfd,__ptr,namelist,filter,compar);
  free(__ptr);
  return iVar1;
}

Assistant:

int
scandirat64(int dirfd, const char *dirp, struct dirent64 ***namelist,
            int (*filter)(const struct dirent64 *),
            int (*compar)(const struct dirent64 **, const struct dirent64 **)) {
    int (*_scandirat64)(int dirfd, const char *dirp, struct dirent64 ***namelist,
                        int (*filter)(const struct dirent64 *),
                        int (*compar)(const struct dirent64 **, const struct dirent64 **));
    char *new_path = NULL;
    int ret;

    _scandirat64 = (int (*)(int dirfd, const char *dirp, struct dirent64 ***namelist,
                            int (*filter)(const struct dirent64 *),
                            int (*compar)(const struct dirent64 **, const struct dirent64 **)))
            dlsym(RTLD_NEXT, "scandirat64");

    new_path = apprun_redirect_path_if_absolute(dirp);
    ret = _scandirat64(dirfd, new_path, namelist, filter, compar);
    free(new_path);

    return ret;
}